

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexSets.cpp
# Opt level: O0

void __thiscall TasGrid::StorageSet::write<false>(StorageSet *this,ostream *os)

{
  size_type sVar1;
  ostream *os_local;
  StorageSet *this_local;
  
  IO::writeNumbers<false,(TasGrid::IO::IOPad)1,int,int>
            (os,(int)this->num_outputs,(int)this->num_values);
  sVar1 = ::std::vector<double,_std::allocator<double>_>::size(&this->values);
  IO::writeFlag<false,(TasGrid::IO::IOPad)4>(sVar1 != 0,os);
  sVar1 = ::std::vector<double,_std::allocator<double>_>::size(&this->values);
  if (sVar1 != 0) {
    IO::writeVector<false,(TasGrid::IO::IOPad)3,double>(&this->values,os);
  }
  return;
}

Assistant:

void StorageSet::write(std::ostream &os) const{
    IO::writeNumbers<iomode, IO::pad_rspace>(os, static_cast<int>(num_outputs), static_cast<int>(num_values));
    IO::writeFlag<iomode, IO::pad_auto>((values.size() != 0), os);
    if (values.size() != 0)
        IO::writeVector<iomode, IO::pad_line>(values, os);
}